

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int * f3_get_stem_contributions_d5
                (vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  long lVar1;
  short sVar2;
  undefined2 uVar3;
  uint j_00;
  vrna_param_t *p;
  code *pcVar4;
  code *pcVar5;
  char **ptype_00;
  char *pcVar6;
  vrna_sc_t *pvVar7;
  uint **ppuVar8;
  uchar uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  void *pvVar16;
  int *piVar17;
  void *__ptr;
  int local_dc;
  int local_d0;
  undefined1 *sc_red_stem;
  undefined1 *sc_spl_stem;
  vrna_md_t *md;
  vrna_param_t *P;
  int maxdist;
  int length;
  int *stems;
  int *c;
  int turn;
  int max_j;
  int j;
  int energy;
  uint type;
  uint **a2s;
  uint n_seq;
  uint s;
  short *si1;
  short si;
  short *s5i1;
  short **S5;
  short **S;
  short *S1;
  char **ptype;
  sc_wrapper_f3 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  j_00 = fc->length;
  iVar15 = fc->window_size;
  p = fc->params;
  lVar1 = *(long *)((fc->matrices->field_2).field_0.c + (long)i * 2 + 2) + -4 + (long)i * -4;
  iVar14 = (p->model_details).min_loop_size;
  pvVar16 = vrna_alloc(iVar15 * 4 + 0x18);
  piVar17 = (int *)((long)pvVar16 + (long)i * -4);
  pcVar4 = (code *)sc_wrapper->decomp_stem1;
  pcVar5 = (code *)sc_wrapper->red_stem;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    ptype_00 = fc->ptype_local;
    sVar2 = (fc->field_23).field_0.sequence_encoding[i];
    if ((int)(j_00 - 1) < i + iVar15 + 1) {
      local_d0 = j_00 - 1;
    }
    else {
      local_d0 = i + iVar15 + 1;
    }
    turn = i + iVar14;
    while (iVar13 = turn, turn = iVar13 + 1, turn <= local_d0) {
      piVar17[turn] = 10000000;
      if ((*(int *)(lVar1 + (long)turn * 4) != 10000000) &&
         (uVar9 = (*evaluate)(i,j_00,turn,iVar13 + 2,'\x14',hc_dat_local), uVar9 != '\0')) {
        uVar10 = vrna_get_ptype_window(i + 1,turn,ptype_00);
        iVar13 = *(int *)(lVar1 + (long)turn * 4);
        iVar11 = vrna_E_ext_stem(uVar10,(int)sVar2,-1,p);
        piVar17[turn] = iVar13 + iVar11;
      }
    }
    if (pcVar4 != (code *)0x0) {
      turn = i + iVar14;
      while (iVar14 = turn, turn = iVar14 + 1, turn <= local_d0) {
        if (piVar17[turn] != 10000000) {
          iVar14 = (*pcVar4)(i,turn,iVar14 + 2,sc_wrapper);
          piVar17[turn] = iVar14 + piVar17[turn];
        }
      }
    }
    if ((((int)j_00 <= i + iVar15) &&
        (piVar17[(int)j_00] = 10000000, *(int *)(lVar1 + (long)(int)j_00 * 4) != 10000000)) &&
       (uVar9 = (*evaluate)(i,j_00,i + 1,j_00,'\x0e',hc_dat_local), uVar9 != '\0')) {
      uVar10 = vrna_get_ptype_window(i + 1,j_00,ptype_00);
      iVar15 = *(int *)(lVar1 + (long)(int)j_00 * 4);
      iVar14 = vrna_E_ext_stem(uVar10,(int)sVar2,-1,p);
      piVar17[(int)j_00] = iVar15 + iVar14;
      if (pcVar5 != (code *)0x0) {
        iVar15 = (*pcVar5)(i,i + 1,j_00,sc_wrapper);
        piVar17[(int)j_00] = iVar15 + piVar17[(int)j_00];
      }
    }
  }
  else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar10 = (fc->field_23).field_1.n_seq;
    pcVar6 = (fc->field_23).field_0.ptype_pf_compat;
    pvVar7 = (fc->field_23).field_0.sc;
    ppuVar8 = (fc->field_23).field_1.a2s;
    if ((int)(j_00 - 1) < i + iVar15 + 1) {
      local_dc = j_00 - 1;
    }
    else {
      local_dc = i + iVar15 + 1;
    }
    pvVar16 = vrna_alloc(uVar10 << 1);
    __ptr = vrna_alloc(uVar10 << 1);
    for (a2s._4_4_ = 0; a2s._4_4_ < uVar10; a2s._4_4_ = a2s._4_4_ + 1) {
      if (ppuVar8[a2s._4_4_][i + 1] < 2) {
        uVar3 = 0xffff;
      }
      else {
        uVar3 = *(undefined2 *)(*(long *)(&pvVar7->type + (ulong)a2s._4_4_ * 2) + (long)(i + 1) * 2)
        ;
      }
      *(undefined2 *)((long)pvVar16 + (ulong)a2s._4_4_ * 2) = uVar3;
      *(undefined2 *)((long)__ptr + (ulong)a2s._4_4_ * 2) =
           *(undefined2 *)(*(long *)(pcVar6 + (ulong)a2s._4_4_ * 8) + (long)(i + 1) * 2);
    }
    turn = i + iVar14;
    while (iVar13 = turn, turn = iVar13 + 1, turn <= local_dc) {
      piVar17[turn] = 10000000;
      if ((*(int *)(lVar1 + (long)turn * 4) != 10000000) &&
         (uVar9 = (*evaluate)(i,j_00,turn,iVar13 + 2,'\x14',hc_dat_local), uVar9 != '\0')) {
        max_j = *(int *)(lVar1 + (long)turn * 4);
        for (a2s._4_4_ = 0; a2s._4_4_ < uVar10; a2s._4_4_ = a2s._4_4_ + 1) {
          uVar12 = vrna_get_ptype_md((int)*(short *)((long)__ptr + (ulong)a2s._4_4_ * 2),
                                     (int)*(short *)(*(long *)(pcVar6 + (ulong)a2s._4_4_ * 8) +
                                                    (long)turn * 2),&p->model_details);
          iVar13 = vrna_E_ext_stem(uVar12,(int)*(short *)((long)pvVar16 + (ulong)a2s._4_4_ * 2),-1,p
                                  );
          max_j = iVar13 + max_j;
        }
        piVar17[turn] = max_j;
      }
    }
    if (pcVar4 != (code *)0x0) {
      turn = i + iVar14;
      while (iVar14 = turn, turn = iVar14 + 1, turn <= local_dc) {
        if (piVar17[turn] != 10000000) {
          iVar14 = (*pcVar4)(i,turn,iVar14 + 2,sc_wrapper);
          piVar17[turn] = iVar14 + piVar17[turn];
        }
      }
    }
    if ((((int)j_00 <= i + iVar15) &&
        (piVar17[(int)j_00] = 10000000, *(int *)(lVar1 + (long)(int)j_00 * 4) != 10000000)) &&
       (uVar9 = (*evaluate)(i,j_00,i + 1,j_00,'\x0e',hc_dat_local), uVar9 != '\0')) {
      max_j = *(int *)(lVar1 + (long)(int)j_00 * 4);
      for (a2s._4_4_ = 0; a2s._4_4_ < uVar10; a2s._4_4_ = a2s._4_4_ + 1) {
        uVar12 = vrna_get_ptype_md((int)*(short *)((long)__ptr + (ulong)a2s._4_4_ * 2),
                                   (int)*(short *)(*(long *)(pcVar6 + (ulong)a2s._4_4_ * 8) +
                                                  (long)(int)j_00 * 2),&p->model_details);
        iVar15 = vrna_E_ext_stem(uVar12,(int)*(short *)((long)pvVar16 + (ulong)a2s._4_4_ * 2),-1,p);
        max_j = iVar15 + max_j;
      }
      if (pcVar5 != (code *)0x0) {
        iVar15 = (*pcVar5)(i,i + 1,j_00,sc_wrapper);
        max_j = iVar15 + max_j;
      }
      piVar17[(int)j_00] = max_j;
    }
    free(pvVar16);
    free(__ptr);
  }
  return piVar17;
}

Assistant:

int *
f3_get_stem_contributions_d5(vrna_fold_compound_t       *fc,
                             int                        i,
                             vrna_callback_hc_evaluate  *evaluate,
                             struct default_data        *hc_dat_local,
                             struct sc_wrapper_f3       *sc_wrapper)
{
  char                    **ptype;
  short                   *S1, **S, **S5, *s5i1, si, *si1;
  unsigned int            s, n_seq, **a2s, type;
  int                     energy, j, max_j, turn, *c, *stems, length, maxdist;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f3_split_in_ext_stem *sc_spl_stem;
  sc_f3_reduce_to_stem    *sc_red_stem;

  length  = (int)fc->length;
  maxdist = fc->window_size;
  P       = fc->params;
  md      = &(P->model_details);
  c       = fc->matrices->c_local[i + 1];
  c       -= i + 1;
  turn    = P->model_details.min_loop_size;

  stems = (int *)vrna_alloc(sizeof(int) * (maxdist + 6));
  stems -= i;

  sc_spl_stem = sc_wrapper->decomp_stem1;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      S1    = fc->sequence_encoding;
      ptype = fc->ptype_local;
      si    = S1[i];
      max_j = MIN2(length - 1, i + maxdist + 1);

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT1, hc_dat_local))) {
          type      = vrna_get_ptype_window(i + 1, j, ptype);
          stems[j]  = c[j] +
                      vrna_E_ext_stem(type, si, -1, P);
        }
      }

      if (sc_spl_stem)
        for (j = i + turn + 1; j <= max_j; j++)
          if (stems[j] != INF)
            stems[j] += sc_spl_stem(i, j, j + 1, sc_wrapper);

      if (length <= i + maxdist) {
        j         = length;
        stems[j]  = INF;

        if ((c[j] != INF) &&
            (evaluate(i, j, i + 1, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
          type      = vrna_get_ptype_window(i + 1, j, ptype);
          stems[j]  = c[j] +
                      vrna_E_ext_stem(type, si, -1, P);

          if (sc_red_stem)
            stems[j] += sc_red_stem(i, i + 1, j, sc_wrapper);
        }
      }

      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      n_seq = fc->n_seq;
      S     = fc->S;
      S5    = fc->S5;
      a2s   = fc->a2s;
      max_j = MIN2(length - 1, i + maxdist + 1);

      /* pre-compute S5[s][i] */
      s5i1  = (short *)vrna_alloc(sizeof(short) * n_seq);
      si1   = (short *)vrna_alloc(sizeof(short) * n_seq);
      for (s = 0; s < n_seq; s++) {
        s5i1[s] = (a2s[s][i + 1] > 1) ? S5[s][i + 1] : -1;
        si1[s]  = S[s][i + 1];
      }

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j] != INF) &&
            (evaluate(i, length, j, j + 1, VRNA_DECOMP_EXT_STEM_EXT1, hc_dat_local))) {
          energy = c[j];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si1[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, s5i1[s], -1, P);
          }
          stems[j] = energy;
        }
      }

      if (sc_spl_stem)
        for (j = i + turn + 1; j <= max_j; j++)
          if (stems[j] != INF)
            stems[j] += sc_spl_stem(i, j, j + 1, sc_wrapper);

      if (length <= i + maxdist) {
        j         = length;
        stems[j]  = INF;

        if ((c[j] != INF) &&
            (evaluate(i, j, i + 1, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
          energy = c[j];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si1[s], S[s][j], md);
            energy  += vrna_E_ext_stem(type, s5i1[s], -1, P);
          }

          if (sc_red_stem)
            energy += sc_red_stem(i, i + 1, j, sc_wrapper);

          stems[j] = energy;
        }
      }

      free(s5i1);
      free(si1);

      break;
  }

  return stems;
}